

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ublox.c
# Opt level: O3

slReturn ubxSynchronizer(int fdPort,int maxTimeMs,int verbosity)

{
  ubxMsg pollMsg;
  errInfo error;
  ubxMsg msg_00;
  _Bool _Var1;
  longlong lVar2;
  slReturn pvVar3;
  longlong lVar4;
  slBuffer *psVar5;
  void *info;
  ubxMsg msg;
  ubxMsg ans;
  undefined6 uStack_76;
  ubxChecksum in_stack_ffffffffffffff98;
  undefined6 in_stack_ffffffffffffff9a;
  undefined8 in_stack_ffffffffffffffa0;
  errorInfo_slReturn local_48;
  
  lVar2 = currentTimeMs();
  pvVar3 = flushRx(fdPort);
  _Var1 = isErrorReturn(pvVar3);
  if (_Var1) {
    createErrorInfo(&local_48,
                    "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/ublox.c",
                    "ubxSynchronizer",0x491,pvVar3);
    error.fileName = local_48.fileName;
    error.cause = local_48.cause;
    error.functionName = local_48.functionName;
    error.lineNumber = local_48.lineNumber;
    error._28_4_ = local_48._28_4_;
    makeErrorMsgReturn(error,"could not flush receiver prior to synchronization");
  }
  lVar4 = currentTimeMs();
  if (lVar4 < lVar2 + maxTimeMs) {
    do {
      psVar5 = create_slBuffer(0,LittleEndian);
      msg_00.body._0_2_ = in_stack_ffffffffffffff98;
      msg_00._0_8_ = psVar5;
      msg_00.body._2_6_ = in_stack_ffffffffffffff9a;
      msg_00.checksum.ck_a = SUB82(in_stack_ffffffffffffffa0,0).class;
      msg_00.checksum.ck_b = SUB82(in_stack_ffffffffffffffa0,0).id;
      msg_00._18_6_ = SUB86(in_stack_ffffffffffffffa0,2);
      in_stack_ffffffffffffff98 = calcFletcherChecksum(msg_00);
      pollMsg._18_6_ = in_stack_ffffffffffffff9a;
      pollMsg.checksum = in_stack_ffffffffffffff98;
      pollMsg._2_6_ = uStack_76;
      pollMsg.type.class = '\n';
      pollMsg.type.id = '\x04';
      pollMsg.body = psVar5;
      pvVar3 = pollUbx(fdPort,pollMsg,0x4b0,(ubxMsg *)&stack0xffffffffffffffa0);
      _Var1 = isOkReturn(pvVar3);
      if (_Var1) {
        info = (void *)0x1;
        goto LAB_00108f11;
      }
      lVar4 = currentTimeMs();
    } while (lVar4 < lVar2 + maxTimeMs);
  }
  info = (void *)0x0;
LAB_00108f11:
  pvVar3 = makeOkInfoReturn(info);
  return pvVar3;
}

Assistant:

extern slReturn ubxSynchronizer(int fdPort, int maxTimeMs, int verbosity) {

    long long start = currentTimeMs();

    // flush any junk we might have in the receiver buffer...
    slReturn frResp = flushRx(fdPort);
    if (isErrorReturn(frResp))
        makeErrorMsgReturn(ERR_CAUSE(frResp), "could not flush receiver prior to synchronization");

    // read characters until either we appear to be synchronized or we run out of time...
    while (currentTimeMs() < start + maxTimeMs) {

        // send the request message and wait for the response...
        ubxType type = {UBX_MON, UBX_MON_VER};
        slBuffer *body = create_slBuffer(0, LittleEndian);
        ubxMsg msg = createUbxMsg(type, body);
        ubxMsg ans;
        slReturn result = pollUbx(fdPort, msg, MON_VER_SYNC_MAX_MS, &ans);
        if (isOkReturn(result))
            return makeOkInfoReturn(bool2info(true));
    }
    return makeOkInfoReturn(bool2info(false));
}